

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreeview.cpp
# Opt level: O1

void __thiscall
QTreeView::selectionChanged(QTreeView *this,QItemSelection *selected,QItemSelection *deselected)

{
  QTreeViewPrivate *this_00;
  char cVar1;
  int iVar2;
  long in_FS_OFFSET;
  QArrayData *local_b0;
  code **local_a8;
  long local_a0;
  QArrayData *local_98;
  code **ppcStack_90;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_88;
  code *local_78;
  code *pcStack_70;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  code *local_58;
  undefined8 uStack_50;
  QTreeView *pQStack_48;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractItemView::selectionChanged((QAbstractItemView *)this,selected,deselected);
  cVar1 = QAccessible::isActive();
  if (cVar1 != '\0') {
    this_00 = *(QTreeViewPrivate **)
               &(this->super_QAbstractItemView).super_QAbstractScrollArea.super_QFrame.super_QWidget
                .field_0x8;
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_78 = (code *)&DAT_aaaaaaaaaaaaaaaa;
    pcStack_70 = (code *)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::indexes();
    local_58 = (code *)0xffffffffffffffff;
    uStack_50 = 0;
    pQStack_48 = (QTreeView *)0x0;
    if (local_88.ptr == (QAbstractItemModel *)0x0) {
      ppcStack_90 = &local_58;
    }
    local_78 = *ppcStack_90;
    pcStack_70 = ppcStack_90[1];
    local_68.ptr = (QAbstractItemModel *)ppcStack_90[2];
    if (local_98 != (QArrayData *)0x0) {
      LOCK();
      (local_98->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_98->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_98->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_98,0x18,0x10);
      }
    }
    if (((-1 < (int)local_78) && (-1 < (long)local_78)) &&
       (local_68.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = QTreeViewPrivate::accessibleTree2Index(this_00,(QModelIndex *)&local_78);
      local_58 = QFont::strikeOut;
      uStack_50 = 0xaaaaaaaa00008007;
      _iStack_40 = CONCAT44(0xaaaaaaaa,iVar2);
      pQStack_48 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
    }
    local_88.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    local_98 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
    ppcStack_90 = (code **)&DAT_aaaaaaaaaaaaaaaa;
    QItemSelection::indexes();
    local_58 = (code *)0xffffffffffffffff;
    uStack_50 = 0;
    pQStack_48 = (QTreeView *)0x0;
    if (local_a0 == 0) {
      local_a8 = &local_58;
    }
    local_98 = (QArrayData *)*local_a8;
    ppcStack_90 = (code **)local_a8[1];
    local_88.ptr = (QAbstractItemModel *)local_a8[2];
    if (local_b0 != (QArrayData *)0x0) {
      LOCK();
      (local_b0->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_b0->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_b0->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_b0,0x18,0x10);
      }
    }
    if (((-1 < (int)local_98) && (-1 < (long)local_98)) &&
       (local_88.ptr != (QAbstractItemModel *)0x0)) {
      iVar2 = QTreeViewPrivate::accessibleTree2Index(this_00,(QModelIndex *)&local_98);
      local_58 = QFont::strikeOut;
      uStack_50 = 0xaaaaaaaa00008008;
      _iStack_40 = CONCAT44(0xaaaaaaaa,iVar2);
      pQStack_48 = this;
      QAccessible::updateAccessibility((QAccessibleEvent *)&local_58);
      QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_58);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTreeView::selectionChanged(const QItemSelection &selected,
                                 const QItemSelection &deselected)
{
    QAbstractItemView::selectionChanged(selected, deselected);
#if QT_CONFIG(accessibility)
    if (QAccessible::isActive()) {
        Q_D(QTreeView);

        // ### does not work properly for selection ranges.
        QModelIndex sel = selected.indexes().value(0);
        if (sel.isValid()) {
            int entry = d->accessibleTree2Index(sel);
            Q_ASSERT(entry >= 0);
            QAccessibleEvent event(this, QAccessible::SelectionAdd);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
        QModelIndex desel = deselected.indexes().value(0);
        if (desel.isValid()) {
            int entry = d->accessibleTree2Index(desel);
            Q_ASSERT(entry >= 0);
            QAccessibleEvent event(this, QAccessible::SelectionRemove);
            event.setChild(entry);
            QAccessible::updateAccessibility(&event);
        }
    }
#endif
}